

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<SuperClass>::copyAppend
          (QGenericArrayOps<SuperClass> *this,SuperClass *b,SuperClass *e)

{
  qsizetype *pqVar1;
  SuperClass *pSVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<SuperClass>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<SuperClass>).size;
      pDVar4 = (b->classname).d.d;
      pSVar2[lVar3].classname.d.d = pDVar4;
      pSVar2[lVar3].classname.d.ptr = (b->classname).d.ptr;
      pSVar2[lVar3].classname.d.size = (b->classname).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->qualified).d.d;
      pSVar2[lVar3].qualified.d.d = pDVar4;
      pSVar2[lVar3].qualified.d.ptr = (b->qualified).d.ptr;
      pSVar2[lVar3].qualified.d.size = (b->qualified).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar2[lVar3].access = b->access;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<SuperClass>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }